

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.c
# Opt level: O1

void riff_free(riff *stream)

{
  riff *stream_00;
  long lVar1;
  ulong uVar2;
  
  if (stream != (riff *)0x0) {
    if (stream->chunks != (riff_chunk *)0x0) {
      if (stream->chunk_count != 0) {
        lVar1 = 0x10;
        uVar2 = 0;
        do {
          stream_00 = *(riff **)((long)&stream->chunks->type + lVar1);
          if (stream_00 != (riff *)0x0) {
            riff_free(stream_00);
          }
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x18;
        } while (uVar2 < stream->chunk_count);
      }
      free(stream->chunks);
    }
    free(stream);
    return;
  }
  return;
}

Assistant:

void riff_free( struct riff * stream )
{
	if ( stream )
	{
		if ( stream->chunks )
		{
			unsigned i;
			for ( i = 0; i < stream->chunk_count; ++i )
			{
				struct riff_chunk * chunk = stream->chunks + i;
                if ( chunk->nested ) riff_free( chunk->nested );
			}
			free( stream->chunks );
		}
		free( stream );
	}
}